

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O0

uint * Gia_ManTerStateLookup(uint *pState,int nWords,uint **pBins,int nBins)

{
  int iVar1;
  uint *puStack_38;
  int Hash;
  uint *pEntry;
  int nBins_local;
  uint **pBins_local;
  int nWords_local;
  uint *pState_local;
  
  iVar1 = Gia_ManTerStateHash(pState,nWords,nBins);
  puStack_38 = pBins[iVar1];
  while( true ) {
    if (puStack_38 == (uint *)0x0) {
      return (uint *)0x0;
    }
    iVar1 = memcmp(puStack_38,pState,(long)nWords << 2);
    if (iVar1 == 0) break;
    puStack_38 = Gia_ManTerStateNext(puStack_38,nWords);
  }
  return puStack_38;
}

Assistant:

unsigned * Gia_ManTerStateLookup( unsigned * pState, int nWords, unsigned ** pBins, int nBins )
{
    unsigned * pEntry;
    int Hash = Gia_ManTerStateHash( pState, nWords, nBins );
    for ( pEntry = pBins[Hash]; pEntry; pEntry = Gia_ManTerStateNext(pEntry, nWords) )
        if ( !memcmp( pEntry, pState, sizeof(unsigned) * nWords ) )
            return pEntry;
    return NULL;
}